

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  StringData sdata;
  StringData local_50;
  
  if (value == (string *)0x0) {
    return false;
  }
  paVar1 = &local_50.value.field_2;
  local_50.value._M_string_length = 0;
  local_50.value.field_2._M_local_buf[0] = '\0';
  local_50.is_triple_quoted = false;
  local_50.single_quote = false;
  local_50.line_row = 0;
  local_50.line_col = 0;
  local_50.value._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = MaybeTripleQuotedString(this,&local_50);
  if (!bVar2) {
    bVar3 = MaybeString(this,&local_50);
    bVar2 = true;
    if (!bVar3) goto LAB_0036ebca;
  }
  ::std::__cxx11::string::_M_assign((string *)value);
  bVar2 = false;
LAB_0036ebca:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.value._M_dataplus._M_p,
                    CONCAT71(local_50.value.field_2._M_allocated_capacity._1_7_,
                             local_50.value.field_2._M_local_buf[0]) + 1);
  }
  bVar3 = true;
  if (bVar2) {
    bVar3 = ReadStringLiteral(this,value);
  }
  return bVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(std::string *value) {
  if (!value) {
    return false;
  }

  // May be triple-quoted string
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      (*value) = sdata.value;
      return true;

    } else if (MaybeString(&sdata)) {
      (*value) = sdata.value;
      return true;
    }
  }

  // Just in case
  return ReadStringLiteral(value);
}